

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O2

void __thiscall M7Getter::~M7Getter(M7Getter *this)

{
  pointer pp_Var1;
  _st_m7_algo_count_t *p_Var2;
  size_t i;
  ulong uVar3;
  
  for (uVar3 = 0;
      pp_Var1 = (this->algo_count).
                super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->algo_count).
                            super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3);
      uVar3 = uVar3 + 1) {
    p_Var2 = pp_Var1[uVar3];
    if (p_Var2 != (_st_m7_algo_count_t *)0x0) {
      operator_delete(p_Var2);
      (this->algo_count).
      super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = (_st_m7_algo_count_t *)0x0;
    }
  }
  std::_Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>::~_Vector_base
            (&(this->algo_count).
              super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>);
  return;
}

Assistant:

M7Getter::~M7Getter()
{
    for (size_t i = 0; i < algo_count.size(); i++)
    {
        if (algo_count[i] != NULL)
        {
            delete algo_count[i];
            algo_count[i] = NULL;
        }
    }
}